

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.cpp
# Opt level: O0

int omp_target_is_present(void *ptr,int device_num)

{
  int iVar1;
  size_type sVar2;
  void *pvVar3;
  int in_ESI;
  long in_RDI;
  int64_t unaff_retaddr;
  int rc;
  bool IsLast;
  DeviceTy *Device;
  size_t Devices_size;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined1 UpdateRefCount;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  uint uVar4;
  
  if (in_RDI == 0) {
    uVar4 = 0;
  }
  else {
    iVar1 = omp_get_initial_device();
    UpdateRefCount = (undefined1)((ulong)in_RDI >> 0x38);
    if (in_ESI == iVar1) {
      uVar4 = 1;
    }
    else {
      std::mutex::lock((mutex *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
      sVar2 = std::vector<DeviceTy,_std::allocator<DeviceTy>_>::size(&Devices);
      std::mutex::unlock((mutex *)0x1026cf);
      if ((ulong)(long)in_ESI < sVar2) {
        std::vector<DeviceTy,_std::allocator<DeviceTy>_>::operator[](&Devices,(long)in_ESI);
        pvVar3 = DeviceTy::getTgtPtrBegin
                           (Device,_rc,unaff_retaddr,
                            (bool *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                            (bool)UpdateRefCount);
        uVar4 = (uint)(pvVar3 != (void *)0x0);
      }
      else {
        uVar4 = 0;
      }
    }
  }
  return uVar4;
}

Assistant:

EXTERN int omp_target_is_present(void *ptr, int device_num) {
  DP("Call to omp_target_is_present for device %d and address " DPxMOD "\n",
      device_num, DPxPTR(ptr));

  if (!ptr) {
    DP("Call to omp_target_is_present with NULL ptr, returning false\n");
    return false;
  }

  if (device_num == omp_get_initial_device()) {
    DP("Call to omp_target_is_present on host, returning true\n");
    return true;
  }

  RTLsMtx.lock();
  size_t Devices_size = Devices.size();
  RTLsMtx.unlock();
  if (Devices_size <= (size_t)device_num) {
    DP("Call to omp_target_is_present with invalid device ID, returning "
        "false\n");
    return false;
  }

  DeviceTy& Device = Devices[device_num];
  bool IsLast; // not used
  int rc = (Device.getTgtPtrBegin(ptr, 0, IsLast, false) != NULL);
  DP("Call to omp_target_is_present returns %d\n", rc);
  return rc;
}